

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_encode_int_all_sizes(char (*mp_nums) [16],int64_t val)

{
  bool bVar1;
  int local_44;
  int local_40;
  int i;
  int used;
  int count;
  int sizes [5];
  int64_t val_local;
  char (*mp_nums_local) [16];
  
  _used = 0x200000001;
  sizes[0] = 3;
  sizes[1] = 5;
  sizes[2] = 9;
  local_40 = 0;
  local_44 = 0;
  while( true ) {
    if (4 < local_44) {
      return local_40;
    }
    if (0xf < local_40) break;
    bVar1 = test_encode_int_custom_size(mp_nums[local_40],val,(&used)[local_44]);
    if (bVar1) {
      local_40 = local_40 + 1;
    }
    local_44 = local_44 + 1;
  }
  __assert_fail("used < MP_NUMBER_CODEC_COUNT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x35e,"int test_encode_int_all_sizes(char (*)[16], int64_t)");
}

Assistant:

static int
test_encode_int_all_sizes(char mp_nums[][MP_NUMBER_MAX_LEN], int64_t val)
{
	int sizes[] = {1, 2, 3, 5, 9};
	int count = lengthof(sizes);
	int used = 0;
	for (int i = 0; i < count; ++i) {
		assert(used < MP_NUMBER_CODEC_COUNT);
		if (test_encode_int_custom_size(mp_nums[used], val, sizes[i]))
			++used;
	}
	return used;
}